

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void msg_start(char *name)

{
  char *pcVar1;
  char *in_RDI;
  char *args;
  char *tmp;
  service *svc;
  char *in_stack_000002f8;
  service *in_stack_00000300;
  char *__s;
  service *local_10;
  
  __s = (char *)0x0;
  pcVar1 = strchr(in_RDI,0x3a);
  if (pcVar1 == (char *)0x0) {
    local_10 = service_find_by_name(__s);
  }
  else {
    __s = strdup(in_RDI);
    pcVar1 = strchr(__s,0x3a);
    *pcVar1 = '\0';
    local_10 = service_find_by_name(__s);
  }
  if (local_10 == (service *)0x0) {
    log_write(3,"<3>init: no such service \'%s\'\n",in_RDI);
  }
  else {
    service_start(in_stack_00000300,in_stack_000002f8);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return;
}

Assistant:

static void msg_start(const char *name)
{
    struct service *svc;
    char *tmp = NULL;
    char *args = NULL;

    if (!strchr(name, ':'))
        svc = service_find_by_name(name);
    else {
        tmp = strdup(name);
        args = strchr(tmp, ':');
        *args = '\0';
        args++;

        svc = service_find_by_name(tmp);
    }
    
    if (svc) {
        service_start(svc, args);
    } else {
        ERROR("no such service '%s'\n", name);
    }
    if (tmp)
        free(tmp);
}